

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNErrCode SUNSparseMatrix_Realloc(SUNMatrix A)

{
  size_t __size;
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  
  pvVar1 = A->content;
  lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x38) + *(long *)((long)pvVar1 + 0x18) * 8);
  __size = lVar2 * 8;
  pvVar3 = realloc(*(void **)((long)pvVar1 + 0x30),__size);
  pvVar1 = A->content;
  *(void **)((long)pvVar1 + 0x30) = pvVar3;
  pvVar3 = realloc(*(void **)((long)pvVar1 + 0x20),__size);
  pvVar1 = A->content;
  *(void **)((long)pvVar1 + 0x20) = pvVar3;
  *(long *)((long)pvVar1 + 0x10) = lVar2;
  return 0;
}

Assistant:

SUNErrCode SUNSparseMatrix_Realloc(SUNMatrix A)
{
  sunindextype nzmax;
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);

  /* get total number of nonzeros (return with failure if illegal) */
  nzmax = (SM_INDEXPTRS_S(A))[SM_NP_S(A)];
  SUNAssert(nzmax >= 0, SUN_ERR_ARG_CORRUPT);

  /* perform reallocation */
  SM_INDEXVALS_S(A) = (sunindextype*)realloc(SM_INDEXVALS_S(A),
                                             nzmax * sizeof(sunindextype));
  SUNAssert(SM_INDEXVALS_S(A), SUN_ERR_MALLOC_FAIL);

  SM_DATA_S(A) = (sunrealtype*)realloc(SM_DATA_S(A), nzmax * sizeof(sunrealtype));
  SUNAssert(SM_DATA_S(A), SUN_ERR_MALLOC_FAIL);

  SM_NNZ_S(A) = nzmax;

  return SUN_SUCCESS;
}